

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

void __thiscall
re2::DFA::RunWorkqOnByte
          (DFA *this,Workq *oldq,Workq *newq,int c,uint flag,bool *ismatch,MatchKind kind)

{
  int *piVar1;
  Workq *q;
  bool bVar2;
  InstOp IVar3;
  int id_00;
  iterator piVar4;
  ostream *poVar5;
  LogMessage local_1c8;
  Inst *local_48;
  Inst *ip;
  iterator piStack_38;
  int id;
  iterator i;
  bool *ismatch_local;
  uint flag_local;
  int c_local;
  Workq *newq_local;
  Workq *oldq_local;
  DFA *this_local;
  
  i = (iterator)ismatch;
  ismatch_local._0_4_ = flag;
  ismatch_local._4_4_ = c;
  _flag_local = newq;
  newq_local = oldq;
  oldq_local = (Workq *)this;
  Mutex::AssertHeld(&this->mutex_);
  Workq::clear(_flag_local);
  piStack_38 = SparseSet::begin(&newq_local->super_SparseSet);
  do {
    piVar1 = piStack_38;
    piVar4 = SparseSet::end(&newq_local->super_SparseSet);
    if (piVar1 == piVar4) {
      return;
    }
    bVar2 = Workq::is_mark(newq_local,*piStack_38);
    if (bVar2) {
      if ((*i & 1) != 0) {
        return;
      }
      Workq::mark(_flag_local);
    }
    else {
      ip._4_4_ = *piStack_38;
      local_48 = Prog::inst(this->prog_,ip._4_4_);
      IVar3 = Prog::Inst::opcode(local_48);
      if (IVar3 != kInstAltMatch) {
        if (IVar3 == kInstByteRange) {
          bVar2 = Prog::Inst::Matches(local_48,ismatch_local._4_4_);
          q = _flag_local;
          if (bVar2) {
            id_00 = Prog::Inst::out(local_48);
            AddToQueue(this,q,id_00,(uint)ismatch_local);
          }
        }
        else if (1 < IVar3 - kInstCapture) {
          if (IVar3 == kInstMatch) {
            bVar2 = Prog::anchor_end(this->prog_);
            if (((!bVar2) || (ismatch_local._4_4_ == 0x100)) &&
               (*(undefined1 *)i = 1, kind == kFirstMatch)) {
              return;
            }
          }
          else if (1 < IVar3 - kInstNop) {
            LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_1c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc"
                       ,0x3a2);
            poVar5 = LogMessage::stream(&local_1c8);
            poVar5 = std::operator<<(poVar5,"unhandled opcode: ");
            IVar3 = Prog::Inst::opcode(local_48);
            std::ostream::operator<<(poVar5,IVar3);
            LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1c8);
          }
        }
      }
    }
    piStack_38 = piStack_38 + 1;
  } while( true );
}

Assistant:

void DFA::RunWorkqOnByte(Workq* oldq, Workq* newq,
                         int c, uint flag, bool* ismatch,
                         Prog::MatchKind kind) {
  if (DEBUG_MODE)
    mutex_.AssertHeld();

  newq->clear();
  for (Workq::iterator i = oldq->begin(); i != oldq->end(); ++i) {
    if (oldq->is_mark(*i)) {
      if (*ismatch)
        return;
      newq->mark();
      continue;
    }
    int id = *i;
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstFail:        // never succeeds
      case kInstCapture:     // already followed
      case kInstNop:         // already followed
      case kInstAltMatch:    // already followed
      case kInstEmptyWidth:  // already followed
        break;

      case kInstByteRange:   // can follow if c is in range
        if (ip->Matches(c))
          AddToQueue(newq, ip->out(), flag);
        break;

      case kInstMatch:
        if (prog_->anchor_end() && c != kByteEndText)
          break;
        *ismatch = true;
        if (kind == Prog::kFirstMatch) {
          // Can stop processing work queue since we found a match.
          return;
        }
        break;
    }
  }

  if (DebugDFA)
    fprintf(stderr, "%s on %d[%#x] -> %s [%d]\n", DumpWorkq(oldq).c_str(),
            c, flag, DumpWorkq(newq).c_str(), *ismatch);
}